

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cc
# Opt level: O0

void __thiscall ipx::Control::hLog(Control *this,string *str)

{
  undefined8 uVar1;
  HighsLogOptions *in_RSI;
  long in_RDI;
  HighsLogOptions log_options_;
  HighsLogOptions *log_options__00;
  HighsLogOptions local_70;
  
  if ((*(byte *)(in_RDI + 0xe4) & 1) == 0) {
    std::operator<<((ostream *)(in_RDI + 0x308),(string *)in_RSI);
  }
  else {
    log_options__00 = &local_70;
    HighsLogOptions::HighsLogOptions(in_RSI,log_options__00);
    uVar1 = std::__cxx11::string::c_str();
    highsLogUser(log_options__00,kInfo,"%s",uVar1);
    HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x81475c);
  }
  return;
}

Assistant:

void Control::hLog(std::string str) const {
  if (parameters_.highs_logging) {
    assert(parameters_.log_options);
    HighsLogOptions log_options_ = *(parameters_.log_options);
    highsLogUser(log_options_, HighsLogType::kInfo, "%s", str.c_str());
  } else {
    output_ << str;
  }

}